

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O1

void __thiscall cmGeneratedFileStream::cmGeneratedFileStream(cmGeneratedFileStream *this)

{
  std::ios_base::ios_base((ios_base *)&(this->super_ofstream).field_0x140);
  *(code **)&(this->super_ofstream).field_0x140 = std::__cxx11::string::string;
  *(undefined8 *)&this->field_0x218 = 0;
  *(undefined2 *)&this->field_0x220 = 0;
  *(undefined8 *)&this->field_0x228 = 0;
  *(undefined8 *)&this->field_0x230 = 0;
  *(undefined8 *)&this->field_0x238 = 0;
  *(undefined8 *)&this->field_0x240 = 0;
  *(undefined1 **)
   &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x108;
  *(undefined8 *)
   &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x100 = 0;
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x108 = 0;
  *(undefined1 **)&(this->super_ofstream).field_0x118 = &(this->super_ofstream).field_0x128;
  *(undefined8 *)&(this->super_ofstream).field_0x120 = 0;
  (this->super_ofstream).field_0x128 = 0;
  *(undefined4 *)&(this->super_ofstream).field_0x138 = 0x1000000;
  std::ofstream::ofstream(this);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x6d4770;
  *(undefined8 *)&(this->super_ofstream).field_0x140 = 0x6d4798;
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream():
  cmGeneratedFileStreamBase(), Stream()
{
}